

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O3

void __thiscall QHeaderViewPrivate::initializeIndexMapping(QHeaderViewPrivate *this)

{
  int iVar1;
  long lVar2;
  pointer piVar3;
  int s;
  long lVar4;
  
  lVar4 = (this->visualIndices).d.size;
  if (this->headerMode == InitialNoSectionMemoryUsage) {
    lVar2 = (long)(int)this->countInNoSectionItemsMode;
    if ((lVar4 == lVar2) && ((this->logicalIndices).d.size == lVar2)) {
      return;
    }
    iVar1 = (int)this->countInNoSectionItemsMode;
  }
  else {
    iVar1 = (int)(this->sectionItems).d.size;
    if (lVar4 == iVar1) {
      if ((this->logicalIndices).d.size == (long)iVar1) {
        return;
      }
      iVar1 = (int)(this->sectionItems).d.size;
    }
  }
  QList<int>::resize(&this->visualIndices,(long)iVar1);
  if (this->headerMode == InitialNoSectionMemoryUsage) {
    iVar1 = (int)this->countInNoSectionItemsMode;
  }
  else {
    iVar1 = (int)(this->sectionItems).d.size;
  }
  QList<int>::resize(&this->logicalIndices,(long)iVar1);
  lVar4 = 0;
  while( true ) {
    if (this->headerMode == InitialNoSectionMemoryUsage) {
      iVar1 = (int)this->countInNoSectionItemsMode;
    }
    else {
      iVar1 = (int)(this->sectionItems).d.size;
    }
    if (iVar1 <= lVar4) break;
    piVar3 = QList<int>::data(&this->visualIndices);
    piVar3[lVar4] = (int)lVar4;
    piVar3 = QList<int>::data(&this->logicalIndices);
    piVar3[lVar4] = (int)lVar4;
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

inline void initializeIndexMapping() const {
        if (visualIndices.size() != sectionCount()
            || logicalIndices.size() != sectionCount()) {
            visualIndices.resize(sectionCount());
            logicalIndices.resize(sectionCount());
            for (int s = 0; s < sectionCount(); ++s) {
                visualIndices[s] = s;
                logicalIndices[s] = s;
            }
        }
    }